

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

int __thiscall pbrt::NanoVDBBuffer::init(NanoVDBBuffer *this,EVP_PKEY_CTX *ctx)

{
  NanoVDBBuffer *pNVar1;
  NanoVDBBuffer *extraout_RAX;
  uint8_t *puVar2;
  EVP_PKEY_CTX *this_00;
  
  if (ctx != (EVP_PKEY_CTX *)this->bytesAllocated) {
    pNVar1 = this;
    this_00 = ctx;
    if (this->bytesAllocated != 0) {
      clear((NanoVDBBuffer *)ctx);
      pNVar1 = extraout_RAX;
      this_00 = ctx;
    }
    ctx = (EVP_PKEY_CTX *)pNVar1;
    if (this_00 != (EVP_PKEY_CTX *)0x0) {
      this->bytesAllocated = (size_t)this_00;
      ctx = (EVP_PKEY_CTX *)this;
      puVar2 = (uint8_t *)
               pstd::pmr::polymorphic_allocator<std::byte>::allocate_bytes
                         ((polymorphic_allocator<std::byte> *)this_00,(size_t)this,0x74050d);
      ((NanoVDBBuffer *)ctx)->ptr = puVar2;
    }
  }
  return (int)ctx;
}

Assistant:

void init(uint64_t size) {
        if (size == bytesAllocated)
            return;
        if (bytesAllocated > 0)
            clear();
        if (size == 0)
            return;
        bytesAllocated = size;
        ptr = (uint8_t *)alloc.allocate_bytes(bytesAllocated, 128);
    }